

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O3

int countNamelessRecords(int m,int firstcode)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  uint uVar6;
  
  uVar2 = firstNamelessRecord(m,firstcode);
  piVar5 = &TERRITORY_BOUNDARIES[m].flags;
  uVar1 = *piVar5;
  uVar6 = uVar1 & 0x1f;
  iVar3 = m + ~uVar2;
  do {
    uVar2 = *piVar5;
    uVar4 = uVar2 & 0x1f;
    iVar3 = iVar3 + 1;
    piVar5 = piVar5 + 5;
  } while ((byte)(((byte)uVar2 & 0x1f) + (char)(uVar4 * 0x34 >> 8) * -5 + (char)(uVar4 / 5) * '\n' +
                 '\x01') ==
           (byte)(((byte)uVar1 & 0x1f) + (char)(uVar6 * 0x34 >> 8) * -5 + (char)(uVar6 / 5) * '\n' +
                 '\x01'));
  return iVar3;
}

Assistant:

static int countNamelessRecords(const int m, const int firstcode) {
    const int first = firstNamelessRecord(m, firstcode);
    const int codexm = coDex(m);
    int last = m;
    ASSERT((0 <= m) && (m <= MAPCODE_BOUNDARY_MAX));
    ASSERT((0 <= firstcode) && (firstcode <= MAPCODE_BOUNDARY_MAX));
    while (coDex(last) == codexm) {
        last++;
    }
    ASSERT((0 <= last) && (last <= MAPCODE_BOUNDARY_MAX));
    ASSERT(last >= first);
    return (last - first);
}